

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marshal.c
# Opt level: O2

ptrlen BinarySource_get_string(BinarySource *src)

{
  size_t sVar1;
  _Bool _Var2;
  uint32_t uVar3;
  char *pcVar4;
  ulong wanted;
  ptrlen pVar5;
  
  _Var2 = BinarySource_data_avail(src,4);
  pcVar4 = "";
  if (_Var2) {
    sVar1 = src->pos;
    src->pos = sVar1 + 4;
    uVar3 = GET_32BIT_MSB_FIRST((void *)(sVar1 + (long)src->data));
    wanted = (ulong)uVar3;
    _Var2 = BinarySource_data_avail(src,wanted);
    if (_Var2) {
      sVar1 = src->pos;
      src->pos = sVar1 + wanted;
      pcVar4 = (char *)(sVar1 + (long)src->data);
      goto LAB_00102f0c;
    }
  }
  wanted = 0;
LAB_00102f0c:
  pVar5.len = wanted;
  pVar5.ptr = pcVar4;
  return pVar5;
}

Assistant:

ptrlen BinarySource_get_string(BinarySource *src)
{
    const unsigned char *ucp;
    size_t len;

    if (!avail(4))
        return make_ptrlen("", 0);

    ucp = consume(4);
    len = GET_32BIT_MSB_FIRST(ucp);

    if (!avail(len))
        return make_ptrlen("", 0);

    return make_ptrlen(consume(len), len);
}